

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O2

void __thiscall CDirectiveAutoRegion::writeTempData(CDirectiveAutoRegion *this,TempData *tempData)

{
  int64_t memoryAddress;
  CAssemblerCommand *pCVar1;
  long lVar2;
  long lVar3;
  allocator<char> local_41;
  string local_40;
  
  memoryAddress = this->position;
  tinyformat::format<long>(&local_40,".autoregion 0x%08X",&this->position);
  TempData::writeLine(tempData,memoryAddress,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  CAssemblerCommand::applyFileInfo
            ((this->content)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl);
  pCVar1 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  (*pCVar1->_vptr_CAssemblerCommand[4])(pCVar1,tempData);
  lVar2 = this->position;
  lVar3 = this->contentSize;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,".endautoregion",&local_41)
  ;
  TempData::writeLine(tempData,lVar3 + lVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void CDirectiveAutoRegion::writeTempData(TempData& tempData) const
{
	tempData.writeLine(position,tfm::format(".autoregion 0x%08X",position));
	content->applyFileInfo();
	content->writeTempData(tempData);
	tempData.writeLine(position+contentSize,".endautoregion");
}